

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::glTFImporter::InternReadFile
          (glTFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool isBinary;
  string local_7c0;
  undefined1 local_7a0 [8];
  Asset asset;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  glTFImporter *this_local;
  
  asset.scene._8_8_ = pIOHandler;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->meshOffsets);
  std::vector<int,_std::allocator<int>_>::clear(&this->embeddedTexIdxs);
  this->mScene = pScene;
  glTF::Asset::Asset((Asset *)local_7a0,(IOSystem *)asset.scene._8_8_);
  BaseImporter::GetExtension(&local_7c0,pFile);
  isBinary = std::operator==(&local_7c0,"glb");
  glTF::Asset::Load((Asset *)local_7a0,pFile,isBinary);
  std::__cxx11::string::~string((string *)&local_7c0);
  ImportEmbeddedTextures(this,(Asset *)local_7a0);
  ImportMaterials(this,(Asset *)local_7a0);
  ImportMeshes(this,(Asset *)local_7a0);
  ImportCameras(this,(Asset *)local_7a0);
  ImportLights(this,(Asset *)local_7a0);
  ImportNodes(this,(Asset *)local_7a0);
  ImportCommonMetadata(this,(Asset *)local_7a0);
  if (pScene->mNumMeshes == 0) {
    pScene->mFlags = pScene->mFlags | 1;
  }
  glTF::Asset::~Asset((Asset *)local_7a0);
  return;
}

Assistant:

void glTFImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    // clean all member arrays
    meshOffsets.clear();
    embeddedTexIdxs.clear();

    this->mScene = pScene;

    // read the asset file
    glTF::Asset asset(pIOHandler);
    asset.Load(pFile, GetExtension(pFile) == "glb");


    //
    // Copy the data out
    //

    ImportEmbeddedTextures(asset);
    ImportMaterials(asset);

    ImportMeshes(asset);

    ImportCameras(asset);
    ImportLights(asset);

    ImportNodes(asset);
    ImportCommonMetadata(asset);

    if (pScene->mNumMeshes == 0) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}